

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

void __thiscall pstore::command_line::option::~option(option *this)

{
  options_container *this_00;
  options_container *all;
  option *this_local;
  
  this->_vptr_option = (_func_int **)&PTR__option_00182630;
  this_00 = all_abi_cxx11_();
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::erase
            (this_00,(this->container_pos_)._M_node);
  std::__cxx11::string::~string((string *)&this->description_);
  std::__cxx11::string::~string((string *)&this->usage_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

option::~option () {
                // Remove this option from the global container.
                options_container & all = option::all ();
                all.erase (container_pos_);
            }